

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,Type *type,Imports *imports)

{
  bool bVar1;
  Import *pIVar2;
  BaseType type_00;
  Type local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_7d [13];
  string local_70;
  string local_50;
  Import *local_30;
  Import *import;
  Imports *imports_local;
  Type *type_local;
  PythonStubGenerator *this_local;
  
  import = (Import *)imports;
  imports_local = (Imports *)type;
  type_local = (Type *)this;
  this_local = (PythonStubGenerator *)__return_storage_ptr__;
  if (type->enum_def == (EnumDef *)0x0) {
    bVar1 = IsScalar(type->base_type);
    pIVar2 = import;
    if (bVar1) {
      ScalarType_abi_cxx11_
                (__return_storage_ptr__,
                 (PythonStubGenerator *)
                 (ulong)*(uint *)&(imports_local->imports).
                                  super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
                                  ._M_impl.super__Vector_impl_data._M_start,type_00);
    }
    else {
      switch(*(undefined4 *)
              &(imports_local->imports).
               super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
               ._M_impl.super__Vector_impl_data._M_start) {
      case 0xd:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"str",local_7d);
        std::allocator<char>::~allocator(local_7d);
        break;
      case 0xe:
      case 0x11:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"typing",&local_a1);
        Imports::Import((Imports *)pIVar2,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
        Type::VectorType(&local_108,(Type *)imports_local);
        TypeOf_abi_cxx11_(&local_e8,this,&local_108,(Imports *)import);
        std::operator+(&local_c8,"typing.List[",&local_e8);
        std::operator+(__return_storage_ptr__,&local_c8,"]");
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
        break;
      case 0xf:
        anon_unknown_0::PythonStubGenerator::ModuleFor<flatbuffers::StructDef>
                  (&local_50,(PythonStubGenerator *)this,
                   (StructDef *)
                   (imports_local->imports).
                   super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        IdlNamer::Type_abi_cxx11_
                  (&local_70,(IdlNamer *)(this + 8),
                   (StructDef *)
                   (imports_local->imports).
                   super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        pIVar2 = Imports::Import((Imports *)pIVar2,&local_50,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_30 = pIVar2;
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pIVar2->name);
        break;
      case 0x10:
        UnionType_abi_cxx11_
                  (__return_storage_ptr__,this,
                   (EnumDef *)
                   (imports_local->imports).
                   super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(Imports *)import);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_python.cpp"
                      ,0xf2,
                      "std::string flatbuffers::python::(anonymous namespace)::PythonStubGenerator::TypeOf(const Type &, Imports *) const"
                     );
      }
    }
  }
  else {
    EnumType_abi_cxx11_(__return_storage_ptr__,this,type->enum_def,imports);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TypeOf(const Type &type, Imports *imports) const {
    if (type.enum_def != nullptr) return EnumType(*type.enum_def, imports);
    if (IsScalar(type.base_type)) return ScalarType(type.base_type);

    switch (type.base_type) {
      case BASE_TYPE_STRUCT: {
        const Import &import = imports->Import(ModuleFor(type.struct_def),
                                               namer_.Type(*type.struct_def));
        return import.name;
      }
      case BASE_TYPE_STRING:
        return "str";
      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR: {
        imports->Import("typing");
        return "typing.List[" + TypeOf(type.VectorType(), imports) + "]";
      }
      case BASE_TYPE_UNION:
        return UnionType(*type.enum_def, imports);
      default:
        FLATBUFFERS_ASSERT(0);
        return "";
    }
  }